

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O0

void __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::_remFromP
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,Index idx)

{
  Index k;
  DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *pDVar1;
  Scalar *pSVar2;
  Scalar *__b;
  Scalar *tempData;
  ColXpr local_60;
  Index local_28;
  Index col;
  Index i;
  Index idx_local;
  NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this_local;
  
  i = idx;
  idx_local = (Index)this;
  pDVar1 = (DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)
           PermutationMatrix<-1,_-1,_long>::indices(&this->_P);
  pSVar2 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()(pDVar1,i);
  pDVar1 = (DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)
           PermutationMatrix<-1,_-1,_long>::indices(&this->_P);
  __b = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()(pDVar1,this->_Np + -1);
  std::swap<long>(pSVar2,__b);
  this->_Np = this->_Np + -1;
  for (col = i; col < this->_Np; col = col + 1) {
    pDVar1 = (DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)
             PermutationMatrix<-1,_-1,_long>::indices(&this->_P);
    pSVar2 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()(pDVar1,col);
    local_28 = *pSVar2;
    DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_60,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&this->_A,local_28);
    k = col;
    tempData = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                         (&(this->_tempVector).
                           super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>);
    internal::
    nnls_householder_qr_inplace_update<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
              (&this->_QR,&this->_qrCoeffs,&local_60,k,tempData);
  }
  return;
}

Assistant:

void NNLS<MatrixType>::_remFromP(Index idx)
{
#ifdef EIGEN3_NNLS_DEBUG
  std::cerr << "NNLS(): Remove Idx " << _P.indices()(idx) << "@" << idx << " from passive set ("
            << _P.indices().head(_Np).transpose() << ")" << std::endl;
#endif
  // swap index with last passive one & reduce number of passive columns
  std::swap(_P.indices()(idx), _P.indices()(_Np-1)); _Np--;
  // Update QR decomposition starting from the removed index up to the end [idx, ..., _Np]
  for (Index i=idx; i<_Np; i++) {
    Index col = _P.indices()(i);
    internal::nnls_householder_qr_inplace_update(_QR, _qrCoeffs, _A.col(col), i, _tempVector.data());
  }
}